

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer.cpp
# Opt level: O3

void CS248::Viewer::drawInfo(void)

{
  uint __val;
  OSDText *pOVar1;
  int iVar2;
  long *plVar3;
  uint uVar4;
  long *plVar5;
  ulong uVar6;
  uint __len;
  uint uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  Color color;
  string framerate_info;
  string __str;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  string local_a8;
  string local_88;
  string local_68;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  sys_curr = std::chrono::_V2::system_clock::now();
  if (1.0 <= (double)(sys_curr - sys_last) / 1000000000.0) {
    if ((int)framecount < 0x14) {
      uVar8 = 0x3eb333333f800000;
      if ((int)framecount < 0x14) goto LAB_00182a93;
LAB_00182aa7:
      uVar9 = 0x3f8000003e19999a;
    }
    else {
      uVar8 = 0x3f0000003e19999a;
      if (0x13 < (int)framecount) goto LAB_00182aa7;
LAB_00182a93:
      uVar9 = 0x3f8000003eb33333;
    }
    color.b = (float)(int)uVar9;
    color.a = (float)(int)((ulong)uVar9 >> 0x20);
    color.r = (float)(int)uVar8;
    color.g = (float)(int)((ulong)uVar8 >> 0x20);
    OSDText::set_color(osd_text,line_id_framerate,color);
    __val = -framecount;
    if (0 < (int)framecount) {
      __val = framecount;
    }
    __len = 1;
    if (9 < __val) {
      uVar6 = (ulong)__val;
      uVar7 = 4;
      do {
        __len = uVar7;
        uVar4 = (uint)uVar6;
        if (uVar4 < 100) {
          __len = __len - 2;
          goto LAB_00182b1f;
        }
        if (uVar4 < 1000) {
          __len = __len - 1;
          goto LAB_00182b1f;
        }
        if (uVar4 < 10000) goto LAB_00182b1f;
        uVar6 = uVar6 / 10000;
        uVar7 = __len + 4;
      } while (99999 < uVar4);
      __len = __len + 1;
    }
LAB_00182b1f:
    uVar7 = framecount >> 0x1f;
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct
              ((ulong)local_48,(char)__len - (char)((int)framecount >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>(local_48[0] + uVar7,__len,__val);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_48,0,(char *)0x0,0x2200cb);
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_b8 = *plVar5;
      lStack_b0 = plVar3[3];
      local_c8 = &local_b8;
    }
    else {
      local_b8 = *plVar5;
      local_c8 = (long *)*plVar3;
    }
    local_c0 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_c8);
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_d8 = *plVar5;
      lStack_d0 = plVar3[3];
      local_e8 = &local_d8;
    }
    else {
      local_d8 = *plVar5;
      local_e8 = (long *)*plVar3;
    }
    local_e0 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if (local_c8 != &local_b8) {
      operator_delete(local_c8);
    }
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
    iVar2 = line_id_framerate;
    pOVar1 = osd_text;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,local_e8,local_e0 + (long)local_e8);
    OSDText::set_text(pOVar1,iVar2,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    framecount = 0;
    sys_last = sys_curr;
    if (local_e8 != &local_d8) {
      operator_delete(local_e8);
    }
  }
  else {
    framecount = framecount + 1;
  }
  if (renderer == (long *)0x0) {
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"No input renderer","");
    iVar2 = line_id_renderer;
    pOVar1 = osd_text;
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,local_e8,local_e0 + (long)local_e8);
    OSDText::set_text(pOVar1,iVar2,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if (local_e8 == &local_d8) goto LAB_00182d26;
  }
  else {
    (**(code **)(*renderer + 0x30))(&local_e8);
    iVar2 = line_id_renderer;
    pOVar1 = osd_text;
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,local_e8,local_e0 + (long)local_e8);
    OSDText::set_text(pOVar1,iVar2,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    if (local_e8 == &local_d8) goto LAB_00182d26;
  }
  operator_delete(local_e8);
LAB_00182d26:
  OSDText::render(osd_text);
  return;
}

Assistant:

void Viewer::drawInfo() {

  // compute timers - fps is update every second
  sys_curr = system_clock::now();
  double elapsed = ((duration<double>) (sys_curr - sys_last)).count();
  if (elapsed >= 1.0f) {

    // update framecount OSD
    Color c = framecount < 20 ? Color(1.0, 0.35, 0.35) : Color(0.15, 0.5, 0.15);
    osd_text->set_color(line_id_framerate, c);
    string framerate_info = "Framerate: " + to_string(framecount) + " fps";
    osd_text->set_text(line_id_framerate, framerate_info);

    // reset timer and counter
    framecount = 0;
    sys_last = sys_curr; 

  } else {

    // increment framecount
    framecount++;
  
  }

  // udpate renderer OSD
  // TODO: This is done on every update and it shouldn't be!
  // The viewer should only update when the renderer needs to
  // update the info text. 
  if (renderer) {
    string renderer_info = renderer->info();
    osd_text->set_text(line_id_renderer, renderer_info);
  } else {
    string renderer_info = "No input renderer";
    osd_text->set_text(line_id_renderer, renderer_info);
  }

  // render OSD
  osd_text->render();

}